

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmQtAutoGeneratorInitializer.cxx
# Opt level: O1

string * RccGetExecutable(string *__return_storage_ptr__,cmGeneratorTarget *target,
                         string *qtMajorVersion)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  char *pcVar2;
  int iVar3;
  cmLocalGenerator *this;
  string *psVar4;
  cmGeneratorTarget *pcVar5;
  char *pcVar6;
  string local_48;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  this = cmGeneratorTarget::GetLocalGenerator(target);
  iVar3 = std::__cxx11::string::compare((char *)qtMajorVersion);
  if (iVar3 == 0) {
    paVar1 = &local_48.field_2;
    local_48._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_48,"Qt5::rcc","");
    pcVar5 = cmLocalGenerator::FindGeneratorTargetToUse(this,&local_48);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_48._M_dataplus._M_p != paVar1) {
      operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
    }
    if (pcVar5 == (cmGeneratorTarget *)0x0) {
      psVar4 = cmGeneratorTarget::GetName_abi_cxx11_(target);
      cmSystemTools::Error
                ("Qt5::rcc target not found ",(psVar4->_M_dataplus)._M_p,(char *)0x0,(char *)0x0);
      return __return_storage_ptr__;
    }
    local_48._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_48,"");
    pcVar6 = cmGeneratorTarget::ImportedGetLocation(pcVar5,&local_48);
    pcVar2 = (char *)__return_storage_ptr__->_M_string_length;
    strlen(pcVar6);
    std::__cxx11::string::_M_replace((ulong)__return_storage_ptr__,0,pcVar2,(ulong)pcVar6);
  }
  else {
    iVar3 = std::__cxx11::string::compare((char *)qtMajorVersion);
    if (iVar3 != 0) {
      psVar4 = cmGeneratorTarget::GetName_abi_cxx11_(target);
      cmSystemTools::Error
                ("The CMAKE_AUTORCC feature supports only Qt 4 and Qt 5 ",(psVar4->_M_dataplus)._M_p
                 ,(char *)0x0,(char *)0x0);
      return __return_storage_ptr__;
    }
    paVar1 = &local_48.field_2;
    local_48._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_48,"Qt4::rcc","");
    pcVar5 = cmLocalGenerator::FindGeneratorTargetToUse(this,&local_48);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_48._M_dataplus._M_p != paVar1) {
      operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
    }
    if (pcVar5 == (cmGeneratorTarget *)0x0) {
      psVar4 = cmGeneratorTarget::GetName_abi_cxx11_(target);
      cmSystemTools::Error
                ("Qt4::rcc target not found ",(psVar4->_M_dataplus)._M_p,(char *)0x0,(char *)0x0);
      return __return_storage_ptr__;
    }
    local_48._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_48,"");
    pcVar6 = cmGeneratorTarget::ImportedGetLocation(pcVar5,&local_48);
    pcVar2 = (char *)__return_storage_ptr__->_M_string_length;
    strlen(pcVar6);
    std::__cxx11::string::_M_replace((ulong)__return_storage_ptr__,0,pcVar2,(ulong)pcVar6);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != &local_48.field_2) {
    operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

static std::string RccGetExecutable(cmGeneratorTarget const* target,
                                    const std::string& qtMajorVersion)
{
  std::string rccExec;
  cmLocalGenerator* lg = target->GetLocalGenerator();
  if (qtMajorVersion == "5") {
    cmGeneratorTarget* qt5Rcc = lg->FindGeneratorTargetToUse("Qt5::rcc");
    if (qt5Rcc != CM_NULLPTR) {
      rccExec = qt5Rcc->ImportedGetLocation("");
    } else {
      cmSystemTools::Error("Qt5::rcc target not found ",
                           target->GetName().c_str());
    }
  } else if (qtMajorVersion == "4") {
    cmGeneratorTarget* qt4Rcc = lg->FindGeneratorTargetToUse("Qt4::rcc");
    if (qt4Rcc != CM_NULLPTR) {
      rccExec = qt4Rcc->ImportedGetLocation("");
    } else {
      cmSystemTools::Error("Qt4::rcc target not found ",
                           target->GetName().c_str());
    }
  } else {
    cmSystemTools::Error(
      "The CMAKE_AUTORCC feature supports only Qt 4 and Qt 5 ",
      target->GetName().c_str());
  }
  return rccExec;
}